

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::FieldDescriptor::InternalTypeOnceInit(FieldDescriptor *this)

{
  LogMessage *pLVar1;
  long lVar2;
  long *plVar3;
  undefined4 uVar4;
  long *plVar5;
  Symbol SVar6;
  string name;
  int *local_c0 [2];
  int local_b0 [10];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (*(char *)(*(long *)(this + 0x28) + 0x41) == '\0') {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_c0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1beb);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_c0,"CHECK failed: file()->finished_building_ == true: ")
    ;
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_c0);
  }
  if (*(string **)(this + 0x80) != (string *)0x0) {
    SVar6 = DescriptorPool::CrossLinkOnDemandHelper
                      (*(DescriptorPool **)(*(long *)(this + 0x28) + 0x10),*(string **)(this + 0x80)
                       ,false);
    if (SVar6.type == MESSAGE) {
      lVar2 = 0x68;
      uVar4 = 0xb;
    }
    else {
      if (SVar6.type != ENUM) goto LAB_002d1b35;
      lVar2 = 0x70;
      uVar4 = 0xe;
    }
    *(undefined4 *)(this + 0x38) = uVar4;
    *(anon_union_8_8_13f84498_for_Symbol_2 *)(this + lVar2) = SVar6.field_1;
  }
LAB_002d1b35:
  if ((*(long *)(this + 0x70) != 0) && (*(long *)(this + 0x90) == 0)) {
    if (*(long *)(this + 0x88) != 0) {
      plVar3 = *(long **)(*(long *)(this + 0x70) + 8);
      lVar2 = *plVar3;
      local_c0[0] = &((LogMessage *)local_c0)->line_;
      std::__cxx11::string::_M_construct<char*>((string *)local_c0,lVar2,plVar3[1] + lVar2);
      lVar2 = std::__cxx11::string::rfind((char)(LogMessage *)local_c0,0x2e);
      if (lVar2 == -1) {
        std::__cxx11::string::_M_assign((string *)local_c0);
      }
      else {
        std::__cxx11::string::substr((ulong)local_48,(ulong)local_c0);
        plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_78 = *plVar5;
          lStack_70 = plVar3[3];
          local_88 = &local_78;
        }
        else {
          local_78 = *plVar5;
          local_88 = (long *)*plVar3;
        }
        local_80 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_88,**(ulong **)(this + 0x88));
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_58 = *plVar5;
          lStack_50 = plVar3[3];
          local_68 = &local_58;
        }
        else {
          local_58 = *plVar5;
          local_68 = (long *)*plVar3;
        }
        local_60 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_c0,(string *)&local_68);
        if (local_68 != &local_58) {
          operator_delete(local_68);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88);
        }
        if (local_48[0] != local_38) {
          operator_delete(local_48[0]);
        }
      }
      SVar6 = DescriptorPool::CrossLinkOnDemandHelper
                        (*(DescriptorPool **)(*(long *)(this + 0x28) + 0x10),(string *)local_c0,
                         false);
      if (SVar6.type == ENUM_VALUE) {
        *(anon_union_8_8_13f84498_for_Symbol_2 *)(this + 0x90) = SVar6.field_1;
      }
      if (local_c0[0] != &((LogMessage *)local_c0)->line_) {
        operator_delete(local_c0[0]);
      }
      if (*(long *)(this + 0x90) != 0) {
        return;
      }
    }
    lVar2 = *(long *)(this + 0x70);
    if (*(int *)(lVar2 + 0x2c) == 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_c0,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1c0b);
      pLVar1 = internal::LogMessage::operator<<
                         ((LogMessage *)local_c0,"CHECK failed: enum_type_->value_count(): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar1);
      internal::LogMessage::~LogMessage((LogMessage *)local_c0);
      lVar2 = *(long *)(this + 0x70);
    }
    *(undefined8 *)(this + 0x90) = *(undefined8 *)(lVar2 + 0x30);
  }
  return;
}

Assistant:

void FieldDescriptor::InternalTypeOnceInit() const {
  GOOGLE_CHECK(file()->finished_building_ == true);
  if (type_name_) {
    Symbol result = file()->pool()->CrossLinkOnDemandHelper(
        *type_name_, type_ == FieldDescriptor::TYPE_ENUM);
    if (result.type == Symbol::MESSAGE) {
      type_ = FieldDescriptor::TYPE_MESSAGE;
      message_type_ = result.descriptor;
    } else if (result.type == Symbol::ENUM) {
      type_ = FieldDescriptor::TYPE_ENUM;
      enum_type_ = result.enum_descriptor;
    }
  }
  if (enum_type_ && !default_value_enum_) {
    if (default_value_enum_name_) {
      // Have to build the full name now instead of at CrossLink time,
      // because enum_type_ may not be known at the time.
      std::string name = enum_type_->full_name();
      // Enum values reside in the same scope as the enum type.
      std::string::size_type last_dot = name.find_last_of('.');
      if (last_dot != std::string::npos) {
        name = name.substr(0, last_dot) + "." + *default_value_enum_name_;
      } else {
        name = *default_value_enum_name_;
      }
      Symbol result = file()->pool()->CrossLinkOnDemandHelper(name, true);
      if (result.type == Symbol::ENUM_VALUE) {
        default_value_enum_ = result.enum_value_descriptor;
      }
    }
    if (!default_value_enum_) {
      // We use the first defined value as the default
      // if a default is not explicitly defined.
      GOOGLE_CHECK(enum_type_->value_count());
      default_value_enum_ = enum_type_->value(0);
    }
  }
}